

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O0

void mg_secure_transport_destroy(mg_transport *transport)

{
  mg_allocator *in_RDI;
  mg_secure_transport *self;
  void *in_stack_ffffffffffffffe8;
  
  SSL_free((SSL *)in_RDI[1].free);
  in_RDI[2].malloc = (_func_void_ptr_mg_allocator_ptr_size_t *)0x0;
  in_RDI[1].free = (_func_void_mg_allocator_ptr_void_ptr *)0x0;
  mg_allocator_free(in_RDI,in_stack_ffffffffffffffe8);
  mg_allocator_free(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void mg_secure_transport_destroy(mg_transport *transport) {
  mg_secure_transport *self = (mg_secure_transport *)transport;
  SSL_free(self->ssl);
  self->bio = NULL;
  self->ssl = NULL;
  mg_allocator_free(self->allocator, self->peer_pubkey_fp);
  mg_allocator_free(self->allocator, self);
}